

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# windows.c
# Opt level: O1

gamewin * alloc_gamewin(wchar_t extra)

{
  gamewin *pgVar1;
  gamewin *__s;
  gamewin **ppgVar2;
  
  __s = (gamewin *)malloc((long)extra + 0x28U);
  memset(__s,0,(long)extra + 0x28U);
  pgVar1 = lastgw;
  if (firstgw == (gamewin *)0x0 && lastgw == (gamewin *)0x0) {
    ppgVar2 = &firstgw;
    lastgw = __s;
  }
  else {
    lastgw->next = __s;
    __s->prev = pgVar1;
    ppgVar2 = &lastgw;
  }
  *ppgVar2 = __s;
  return __s;
}

Assistant:

struct gamewin *alloc_gamewin(int extra)
{
    struct gamewin *gw = malloc(sizeof(struct gamewin) + extra);
    memset(gw, 0, sizeof(struct gamewin) + extra);
    
    if (firstgw == NULL && lastgw == NULL)
	firstgw = lastgw = gw;
    else {
	lastgw->next = gw;
	gw->prev = lastgw;
	lastgw = gw;
    }
    
    return gw;
}